

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Interval i;
  Interval args;
  Interval IVar6;
  Interval i_00;
  Interval IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  Vector3fi di;
  Point3fi oi;
  Interval f;
  Interval c;
  Interval b;
  Point3fi local_128;
  undefined1 local_108 [16];
  Interval local_f8;
  Interval IStack_f0;
  float local_e8;
  float local_e4;
  undefined1 local_d8 [16];
  Interval local_c0;
  undefined1 local_b8 [16];
  Interval local_a0;
  Interval local_98;
  Vector3fi local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Interval local_48;
  Interval local_40;
  Interval local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  
  fVar31 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = fVar31;
  auVar8._0_4_ = fVar31;
  auVar8._8_4_ = fVar31;
  auVar8._12_4_ = fVar31;
  fVar31 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar25._4_4_ = fVar31;
  auVar25._0_4_ = fVar31;
  auVar25._8_4_ = fVar31;
  auVar25._12_4_ = fVar31;
  fVar31 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar27._4_4_ = fVar31;
  auVar27._0_4_ = fVar31;
  auVar27._8_4_ = fVar31;
  auVar27._12_4_ = fVar31;
  local_d8._8_8_ = local_d8._0_8_;
  local_d8._0_8_ = __return_storage_ptr__;
  local_128.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar8,auVar25);
  local_128.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar27);
  Transform::operator()((Point3fi *)&local_f8,this->objectFromRender,&local_128);
  fVar31 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = fVar31;
  auVar9._0_4_ = fVar31;
  auVar9._8_4_ = fVar31;
  auVar9._12_4_ = fVar31;
  fVar31 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar26._4_4_ = fVar31;
  auVar26._0_4_ = fVar31;
  auVar26._8_4_ = fVar31;
  auVar26._12_4_ = fVar31;
  fVar31 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._4_4_ = fVar31;
  auVar28._0_4_ = fVar31;
  auVar28._8_4_ = fVar31;
  auVar28._12_4_ = fVar31;
  local_90.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar9,auVar26);
  local_90.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar28);
  Transform::operator()((Vector3fi *)&local_128,this->objectFromRender,&local_90);
  IVar6 = SumSquares<pbrt::Interval>
                    (local_128.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x,
                     local_128.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  local_108._8_8_ = extraout_XMM0_Qb;
  local_108._0_4_ = IVar6.low;
  local_108._4_4_ = IVar6.high;
  IVar6.high = local_f8.high;
  IVar6.low = local_f8.low;
  auVar12._0_8_ = Interval::operator*((Interval *)&local_128,IVar6);
  auVar12._8_56_ = extraout_var_01;
  local_98 = (Interval)vmovlps_avx(auVar12._0_16_);
  i.high = IStack_f0.high;
  i.low = IStack_f0.low;
  IVar6 = Interval::operator*(&local_128.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i);
  IVar6 = Interval::operator+(&local_98,IVar6);
  auVar13._0_8_ = pbrt::operator*(2.0,IVar6);
  auVar13._8_56_ = extraout_var_02;
  uVar1 = vmovlps_avx(auVar13._0_16_);
  local_90.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
       (Float)(int)uVar1;
  local_90.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
       (Float)(int)((ulong)uVar1 >> 0x20);
  IVar7.high = local_f8.high;
  IVar7.low = local_f8.low;
  args.high = IStack_f0.high;
  args.low = IStack_f0.low;
  auVar14._0_8_ = SumSquares<pbrt::Interval>(IVar7,args);
  auVar14._8_56_ = extraout_var_03;
  local_a0 = (Interval)vmovlps_avx(auVar14._0_16_);
  i_00.high = this->radius;
  i_00.low = this->radius;
  IVar6 = Sqr(i_00);
  auVar15._0_8_ = Interval::operator-(&local_a0,IVar6);
  auVar15._8_56_ = extraout_var_04;
  local_98 = (Interval)vmovlps_avx(auVar15._0_16_);
  IVar6 = pbrt::operator*(2.0,(Interval)local_108._0_8_);
  auVar16._0_8_ = Interval::operator/((Interval *)&local_90,IVar6);
  auVar16._8_56_ = extraout_var_05;
  local_a0 = (Interval)vmovlps_avx(auVar16._0_16_);
  IVar6 = Interval::operator*(&local_a0,
                              local_128.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  IVar6 = Interval::operator-(&local_f8,IVar6);
  IVar7 = Interval::operator*(&local_a0,
                              local_128.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  IVar7 = Interval::operator-(&IStack_f0,IVar7);
  local_b8._8_8_ = extraout_XMM0_Qb_00;
  local_b8._0_4_ = IVar7.low;
  local_b8._4_4_ = IVar7.high;
  auVar17._0_8_ = Sqr(IVar6);
  auVar17._8_56_ = extraout_var_06;
  local_c0 = (Interval)vmovlps_avx(auVar17._0_16_);
  IVar6 = Sqr((Interval)local_b8._0_8_);
  IVar6 = Interval::operator+(&local_c0,IVar6);
  IVar6 = Sqrt(IVar6);
  auVar18._0_8_ = pbrt::operator*(4.0,(Interval)local_108._0_8_);
  auVar18._8_56_ = extraout_var_07;
  local_48 = (Interval)vmovlps_avx(auVar18._0_16_);
  local_38.low = this->radius;
  local_38.high = local_38.low;
  IVar7 = Interval::operator+(&local_38,IVar6);
  auVar19._0_8_ = Interval::operator*(&local_48,IVar7);
  auVar19._8_56_ = extraout_var_08;
  local_c0 = (Interval)vmovlps_avx(auVar19._0_16_);
  local_40.low = this->radius;
  local_40.high = local_40.low;
  IVar6 = Interval::operator-(&local_40,IVar6);
  IVar6 = Interval::operator*(&local_c0,IVar6);
  uVar1 = local_d8._0_8_;
  if (0.0 <= IVar6.low) {
    IVar6 = Sqrt(IVar6);
    if (0.0 <= (local_90.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x
                .low + local_90.super_Vector3<pbrt::Interval>.
                       super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high) * 0.5) {
      IVar6 = Interval::operator+((Interval *)&local_90,IVar6);
    }
    else {
      IVar6 = Interval::operator-((Interval *)&local_90,IVar6);
    }
    auVar20._0_8_ = pbrt::operator*(-0.5,IVar6);
    auVar20._8_56_ = extraout_var_09;
    local_c0 = (Interval)vmovlps_avx(auVar20._0_16_);
    IVar6 = Interval::operator/(&local_c0,(Interval)local_108._0_8_);
    local_108._8_8_ = extraout_XMM0_Qb_01;
    local_108._0_4_ = IVar6.low;
    local_108._4_4_ = IVar6.high;
    auVar21._0_8_ = Interval::operator/(&local_98,local_c0);
    auVar21._8_56_ = extraout_var_10;
    auVar8 = auVar21._0_16_;
    local_68 = local_108;
    if (local_108._0_4_ <= auVar21._0_4_) {
      local_68 = auVar8;
      auVar8 = local_108;
    }
    local_58 = vmovshdup_avx(auVar8);
    if (((tMax < local_58._0_4_) || (local_68._0_4_ <= 0.0)) ||
       ((local_78 = vmovshdup_avx(local_68), auVar8._0_4_ <= 0.0 &&
        (auVar8 = local_68, local_58 = local_78, tMax < local_78._0_4_)))) goto LAB_0031e2e6;
    auVar4._4_4_ = local_f8.high;
    auVar4._0_4_ = local_f8.low;
    auVar4._8_4_ = IStack_f0.low;
    auVar4._12_4_ = IStack_f0.high;
    auVar9 = vinsertps_avx(auVar4,ZEXT416((uint)IStack_f0.high),0x10);
    fVar24 = (auVar8._0_4_ + local_58._0_4_) * 0.5;
    auVar25 = vinsertps_avx((undefined1  [16])
                            local_128.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_128.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    local_d8 = ZEXT416((uint)fVar24);
    fVar31 = (local_e8 + local_e4) * 0.5 +
             fVar24 * (local_128.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      local_128.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar10._0_4_ =
         (local_f8.high + auVar9._0_4_) * 0.5 +
         fVar24 * (local_128.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high + auVar25._0_4_) * 0.5;
    auVar10._4_4_ =
         (IStack_f0.low + auVar9._4_4_) * 0.5 +
         fVar24 * (local_128.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low + auVar25._4_4_) * 0.5;
    auVar10._8_4_ = (auVar9._8_4_ + 0.0) * 0.5 + fVar24 * (auVar25._8_4_ + 0.0) * 0.5;
    auVar10._12_4_ = (auVar9._12_4_ + 0.0) * 0.5 + fVar24 * (auVar25._12_4_ + 0.0) * 0.5;
    auVar29._0_4_ = auVar10._0_4_ * auVar10._0_4_;
    auVar29._4_4_ = auVar10._4_4_ * auVar10._4_4_;
    auVar29._8_4_ = auVar10._8_4_ * auVar10._8_4_;
    auVar29._12_4_ = auVar10._12_4_ * auVar10._12_4_;
    auVar9 = vmovshdup_avx(auVar29);
    auVar9 = vfmadd231ss_fma(auVar9,auVar10,auVar10);
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar24 = this->radius / auVar9._0_4_;
    local_b8._0_4_ = auVar10._0_4_ * fVar24;
    local_b8._4_4_ = auVar10._4_4_ * fVar24;
    local_b8._8_4_ = auVar10._8_4_ * fVar24;
    local_b8._12_4_ = auVar10._12_4_ * fVar24;
    auVar9 = vmovshdup_avx(local_b8);
    local_108 = auVar8;
    auVar22._0_4_ = atan2f(auVar9._0_4_,(float)local_b8._0_4_);
    auVar22._4_60_ = extraout_var;
    if ((this->zMin <= fVar31) && (fVar31 <= this->zMax)) {
      uVar2 = vcmpss_avx512f(auVar22._0_16_,ZEXT816(0) << 0x40,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar24 = (float)((uint)bVar3 * (int)(auVar22._0_4_ + 6.2831855) +
                      (uint)!bVar3 * (int)auVar22._0_4_);
      if (fVar24 <= this->phiMax) goto LAB_0031e285;
    }
    if (((float)local_108._0_4_ == (float)local_68._0_4_) &&
       (!NAN((float)local_108._0_4_) && !NAN((float)local_68._0_4_))) {
      if (((float)local_58._0_4_ == (float)local_78._0_4_) &&
         (!NAN((float)local_58._0_4_) && !NAN((float)local_78._0_4_))) goto LAB_0031e2e6;
    }
    if ((float)local_78._0_4_ <= tMax) {
      auVar5._4_4_ = local_f8.high;
      auVar5._0_4_ = local_f8.low;
      auVar5._8_4_ = IStack_f0.low;
      auVar5._12_4_ = IStack_f0.high;
      auVar8 = vinsertps_avx(auVar5,ZEXT416((uint)IStack_f0.high),0x10);
      fVar24 = ((float)local_68._0_4_ + (float)local_78._0_4_) * 0.5;
      auVar9 = vinsertps_avx((undefined1  [16])
                             local_128.super_Point3<pbrt::Interval>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                             ZEXT416((uint)local_128.super_Point3<pbrt::Interval>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
      local_d8 = ZEXT416((uint)fVar24);
      fVar31 = (local_e8 + local_e4) * 0.5 +
               fVar24 * (local_128.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                        local_128.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar11._0_4_ =
           (local_f8.high + auVar8._0_4_) * 0.5 +
           fVar24 * (local_128.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high + auVar9._0_4_) * 0.5;
      auVar11._4_4_ =
           (IStack_f0.low + auVar8._4_4_) * 0.5 +
           fVar24 * (local_128.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low + auVar9._4_4_) * 0.5;
      auVar11._8_4_ = (auVar8._8_4_ + 0.0) * 0.5 + fVar24 * (auVar9._8_4_ + 0.0) * 0.5;
      auVar11._12_4_ = (auVar8._12_4_ + 0.0) * 0.5 + fVar24 * (auVar9._12_4_ + 0.0) * 0.5;
      auVar30._0_4_ = auVar11._0_4_ * auVar11._0_4_;
      auVar30._4_4_ = auVar11._4_4_ * auVar11._4_4_;
      auVar30._8_4_ = auVar11._8_4_ * auVar11._8_4_;
      auVar30._12_4_ = auVar11._12_4_ * auVar11._12_4_;
      auVar8 = vmovshdup_avx(auVar30);
      auVar8 = vfmadd231ss_fma(auVar8,auVar11,auVar11);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar24 = this->radius / auVar8._0_4_;
      local_b8._0_4_ = auVar11._0_4_ * fVar24;
      local_b8._4_4_ = auVar11._4_4_ * fVar24;
      local_b8._8_4_ = auVar11._8_4_ * fVar24;
      local_b8._12_4_ = auVar11._12_4_ * fVar24;
      auVar8 = vmovshdup_avx(local_b8);
      auVar23._0_4_ = atan2f(auVar8._0_4_,(float)local_b8._0_4_);
      auVar23._4_60_ = extraout_var_00;
      if ((this->zMin <= fVar31) && (fVar31 <= this->zMax)) {
        uVar2 = vcmpss_avx512f(auVar23._0_16_,ZEXT816(0) << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar24 = (float)((uint)bVar3 * (int)(auVar23._0_4_ + 6.2831855) +
                        (uint)!bVar3 * (int)auVar23._0_4_);
        if (fVar24 <= this->phiMax) {
LAB_0031e285:
          *(bool *)(uVar1 + 0x14) = true;
          ((aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
            *)uVar1)->__align = (anon_struct_4_0_00000001_for___align)local_d8._0_4_;
          uVar2 = vmovlps_avx(local_b8);
          *(undefined8 *)
           ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                   *)uVar1 + 4) = uVar2;
          *(float *)((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                            *)uVar1 + 0xc) = fVar31;
          *(float *)((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
                            *)uVar1 + 0x10) = fVar24;
          return (optional<pbrt::QuadricIntersection> *)uVar1;
        }
      }
    }
  }
LAB_0031e2e6:
  *(undefined8 *)
   ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
           *)uVar1 + 0x10) = 0;
  *(undefined8 *)
   (aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)> *)uVar1
       = 0;
  *(undefined8 *)
   ((long)(aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)>
           *)uVar1 + 8) = 0;
  return (optional<pbrt::QuadricIntersection> *)uVar1;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        Interval t0, t1;
        // Compute cylinder quadratic coefficients
        Interval a = SumSquares(di.x, di.y);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y);
        Interval c = SumSquares(oi.x, oi.y) - Sqr(Interval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Interval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        Interval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }